

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O1

void __thiscall efsw::FileWatcherGeneric::watch(FileWatcherGeneric *this)

{
  Thread *this_00;
  ThreadFunc *pTVar1;
  
  if (this->mThread != (Thread *)0x0) {
    return;
  }
  this_00 = (Thread *)operator_new(0x18);
  this_00->_vptr_Thread = (_func_int **)&PTR__Thread_0011ec00;
  this_00->mThreadImpl = (ThreadImpl *)0x0;
  pTVar1 = (ThreadFunc *)operator_new(0x20);
  pTVar1->_vptr_ThreadFunc = (_func_int **)&PTR__ThreadFunc_0011eb38;
  pTVar1[1]._vptr_ThreadFunc = (_func_int **)run;
  pTVar1[2]._vptr_ThreadFunc = (_func_int **)0x0;
  pTVar1[3]._vptr_ThreadFunc = (_func_int **)this;
  this_00->mEntryPoint = pTVar1;
  this->mThread = this_00;
  Thread::launch(this_00);
  return;
}

Assistant:

void FileWatcherGeneric::watch() {
	if ( NULL == mThread ) {
		mThread = new Thread( &FileWatcherGeneric::run, this );
		mThread->launch();
	}
}